

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.tab.cc
# Opt level: O1

void __thiscall
tchecker::parsing::program::parser_t::yy_print_<tchecker::parsing::program::parser_t::by_state>
          (parser_t *this,ostream *yyo,
          basic_symbol<tchecker::parsing::program::parser_t::by_state> *yysym)

{
  char cVar1;
  element_type *peVar2;
  long lVar3;
  ostream *poVar4;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  int *piVar7;
  binary_operator_t *pbVar8;
  shared_ptr<tchecker::expression_t> *psVar9;
  _func_int **pp_Var10;
  shared_ptr<tchecker::lvalue_expression_t> *psVar11;
  char *pcVar12;
  element_type *peVar13;
  int iVar14;
  string local_48;
  
  cVar1 = (yysym->super_by_state).state;
  lVar3 = (long)cVar1;
  if ((lVar3 == 0) || (yystos_[lVar3] == -2)) {
    std::__ostream_insert<char,std::char_traits<char>>(yyo,"empty symbol",0xc);
    return;
  }
  if (cVar1 == '\0') {
    iVar14 = -2;
  }
  else {
    iVar14 = (int)(char)yystos_[lVar3];
  }
  pcVar12 = "nterm";
  if (iVar14 < 0x21) {
    pcVar12 = "token";
  }
  std::__ostream_insert<char,std::char_traits<char>>(yyo,pcVar12,5);
  local_48._M_dataplus._M_p._0_1_ = 0x20;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(yyo,(char *)&local_48,1);
  basic_symbol<tchecker::parsing::program::parser_t::by_state>::name_abi_cxx11_(&local_48,yysym);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                              local_48._M_dataplus._M_p._0_1_),
                      local_48._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," (",2);
  pbVar5 = program::operator<<(poVar4,&yysym->location);
  std::__ostream_insert<char,std::char_traits<char>>(pbVar5,": ",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_48._M_dataplus._M_p._1_7_,local_48._M_dataplus._M_p._0_1_) !=
      &local_48.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_48._M_dataplus._M_p._1_7_,local_48._M_dataplus._M_p._0_1_),
                    local_48.field_2._M_allocated_capacity + 1);
  }
  switch(iVar14) {
  case 0x1e:
  case 0x1f:
    pbVar6 = value_type::as<std::__cxx11::string>(&yysym->value);
    std::__ostream_insert<char,std::char_traits<char>>
              (yyo,(pbVar6->_M_dataplus)._M_p,pbVar6->_M_string_length);
    break;
  case 0x24:
  case 0x25:
  case 0x2a:
    psVar9 = (shared_ptr<tchecker::expression_t> *)
             value_type::as<std::shared_ptr<tchecker::statement_t>>(&yysym->value);
    goto LAB_001d7cbd;
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
    value_type::as<std::shared_ptr<tchecker::statement_t>>(&yysym->value);
    goto LAB_001d7c38;
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x31:
    psVar9 = value_type::as<std::shared_ptr<tchecker::expression_t>>(&yysym->value);
    goto LAB_001d7cbd;
  case 0x2f:
    value_type::as<std::shared_ptr<tchecker::expression_t>>(&yysym->value);
LAB_001d7c38:
    std::ostream::_M_insert<void_const*>(yyo);
    break;
  case 0x30:
    pbVar8 = value_type::as<tchecker::binary_operator_t>(&yysym->value);
    tchecker::operator<<(yyo,*pbVar8);
    break;
  case 0x32:
    psVar11 = value_type::as<std::shared_ptr<tchecker::lvalue_expression_t>>(&yysym->value);
    peVar2 = (psVar11->super___shared_ptr<tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    peVar13 = (element_type *)((long)&peVar2->field_0x0 + *(long *)((long)*peVar2 + -0x38));
    pp_Var10 = *(_func_int ***)((long)&peVar2->field_0x0 + *(long *)((long)*peVar2 + -0x38));
    goto LAB_001d7cc3;
  case 0x33:
    psVar9 = (shared_ptr<tchecker::expression_t> *)
             value_type::as<std::shared_ptr<tchecker::var_expression_t>>(&yysym->value);
LAB_001d7cbd:
    peVar13 = (psVar9->super___shared_ptr<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    pp_Var10 = peVar13->_vptr_expression_t;
LAB_001d7cc3:
    (*pp_Var10[4])(peVar13,yyo);
    break;
  case 0x34:
    piVar7 = value_type::as<int>(&yysym->value);
    std::ostream::operator<<((ostream *)yyo,*piVar7);
  }
  local_48._M_dataplus._M_p._0_1_ = 0x29;
  std::__ostream_insert<char,std::char_traits<char>>(yyo,(char *)&local_48,1);
  return;
}

Assistant:

void
  parser_t::yy_print_ (std::ostream& yyo, const basic_symbol<Base>& yysym) const
  {
    std::ostream& yyoutput = yyo;
    YY_USE (yyoutput);
    if (yysym.empty ())
      yyo << "empty symbol";
    else
      {
        symbol_kind_type yykind = yysym.kind ();
        yyo << (yykind < YYNTOKENS ? "token" : "nterm")
            << ' ' << yysym.name () << " ("
            << yysym.location << ": ";
        switch (yykind)
    {
      case symbol_kind::S_TOK_ID: // "identifier"
#line 164 "program.yy"
                 { yyoutput << yysym.value.template as < std::string > (); }
#line 504 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_TOK_INTEGER: // "integer"
#line 164 "program.yy"
                 { yyoutput << yysym.value.template as < std::string > (); }
#line 510 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_sequence_statement: // sequence_statement
#line 165 "program.yy"
                 { yysym.value.template as < std::shared_ptr<tchecker::statement_t> > ()->output(yyoutput); }
#line 516 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_statement: // statement
#line 165 "program.yy"
                 { yysym.value.template as < std::shared_ptr<tchecker::statement_t> > ()->output(yyoutput); }
#line 522 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_if_statement: // if_statement
#line 164 "program.yy"
                 { yyoutput << yysym.value.template as < std::shared_ptr<tchecker::statement_t> > (); }
#line 528 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_loop_statement: // loop_statement
#line 164 "program.yy"
                 { yyoutput << yysym.value.template as < std::shared_ptr<tchecker::statement_t> > (); }
#line 534 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_local_statement: // local_statement
#line 164 "program.yy"
                 { yyoutput << yysym.value.template as < std::shared_ptr<tchecker::statement_t> > (); }
#line 540 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_simple_statement: // simple_statement
#line 164 "program.yy"
                 { yyoutput << yysym.value.template as < std::shared_ptr<tchecker::statement_t> > (); }
#line 546 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_assignment: // assignment
#line 165 "program.yy"
                 { yysym.value.template as < std::shared_ptr<tchecker::statement_t> > ()->output(yyoutput); }
#line 552 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_conjunctive_formula: // conjunctive_formula
#line 165 "program.yy"
                 { yysym.value.template as < std::shared_ptr<tchecker::expression_t> > ()->output(yyoutput); }
#line 558 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_non_atomic_conjunctive_formula: // non_atomic_conjunctive_formula
#line 165 "program.yy"
                 { yysym.value.template as < std::shared_ptr<tchecker::expression_t> > ()->output(yyoutput); }
#line 564 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_atomic_formula: // atomic_formula
#line 165 "program.yy"
                 { yysym.value.template as < std::shared_ptr<tchecker::expression_t> > ()->output(yyoutput); }
#line 570 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_predicate_formula: // predicate_formula
#line 165 "program.yy"
                 { yysym.value.template as < std::shared_ptr<tchecker::expression_t> > ()->output(yyoutput); }
#line 576 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_binary_formula: // binary_formula
#line 164 "program.yy"
                 { yyoutput << yysym.value.template as < std::shared_ptr<tchecker::expression_t> > (); }
#line 582 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_predicate_operator: // predicate_operator
#line 164 "program.yy"
                 { yyoutput << yysym.value.template as < enum tchecker::binary_operator_t > (); }
#line 588 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_term: // term
#line 165 "program.yy"
                 { yysym.value.template as < std::shared_ptr<tchecker::expression_t> > ()->output(yyoutput); }
#line 594 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_lvalue_term: // lvalue_term
#line 165 "program.yy"
                 { yysym.value.template as < std::shared_ptr<tchecker::lvalue_expression_t> > ()->output(yyoutput); }
#line 600 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_variable_term: // variable_term
#line 165 "program.yy"
                 { yysym.value.template as < std::shared_ptr<tchecker::var_expression_t> > ()->output(yyoutput); }
#line 606 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_integer: // integer
#line 164 "program.yy"
                 { yyoutput << yysym.value.template as < tchecker::integer_t > (); }
#line 612 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/program_parser/program.tab.cc"
        break;

      default:
        break;
    }
        yyo << ')';
      }
  }